

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall testing::Matcher<int>::Matcher(Matcher<int> *this,int value)

{
  ComparisonBase<testing::internal::EqMatcher<int>,_int,_testing::internal::AnyEq> local_34;
  Matcher<int> local_30;
  int local_14;
  Matcher<int> *pMStack_10;
  int value_local;
  Matcher<int> *this_local;
  
  local_14 = value;
  pMStack_10 = this;
  internal::MatcherBase<int>::MatcherBase(&this->super_MatcherBase<int>);
  (this->super_MatcherBase<int>).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__Matcher_0020dfe8;
  local_34.rhs_ = (int)Eq<int>(local_14);
  Matcher<testing::internal::EqMatcher<int>,void>(&local_30,(EqMatcher<int> *)&local_34);
  operator=(this,&local_30);
  ~Matcher(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }